

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Abc_Cex_t *
Saig_ManFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fNewOrder,int fVerbose)

{
  int iVar1;
  Saig_RefMan_t *p;
  Aig_Man_t *pAVar2;
  Vec_Int_t *vReasons;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p_00;
  long lVar3;
  long lVar4;
  int level;
  timespec ts;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p = (Saig_RefMan_t *)calloc(1,0x28);
  p->pAig = pAig;
  p->pCex = pCex;
  p->nInputs = nInputs;
  p->fVerbose = fVerbose;
  pAVar2 = Saig_ManUnrollWithCex(pAig,pCex,nInputs,&p->vMapPiF2A);
  p->pFrames = pAVar2;
  vReasons = Saig_RefManFindReason(p);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p->pFrames);
  }
  __ptr = Saig_RefManReason2Inputs(p,vReasons);
  iVar1 = 0xa0fa1e;
  printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
         (ulong)(uint)p->pFrames->nObjs[2],(ulong)(uint)vReasons->nSize,
         (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)__ptr->nSize);
  Abc_Print(iVar1,"%s =","Time");
  level = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  p_00 = Saig_RefManReason2Cex(p,vReasons);
  if (vReasons->pArray != (int *)0x0) {
    free(vReasons->pArray);
    vReasons->pArray = (int *)0x0;
  }
  if (vReasons != (Vec_Int_t *)0x0) {
    free(vReasons);
  }
  Saig_RefManStop(p);
  if (fVerbose != 0) {
    Abc_CexPrintStats(pCex);
    Abc_CexPrintStats(p_00);
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Saig_ManFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fNewOrder, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_RefManStart( pAig, pCex, nInputs, fVerbose );
    vReasons = Saig_RefManFindReason( p );

if ( fVerbose )
Aig_ManPrintStats( p->pFrames );

//    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );

        Vec_IntFree( vRes );

/*
        ////////////////////////////////////
        Vec_IntFree( vReasons );
        vReasons = Saig_RefManRefineWithSat( p, vRes );
        ////////////////////////////////////

        Vec_IntFree( vRes );
        vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );

        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
*/
    }

    pCare = Saig_RefManReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_RefManStop( p );

if ( fVerbose )
Abc_CexPrintStats( pCex );
if ( fVerbose )
Abc_CexPrintStats( pCare );

    return pCare;
}